

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O1

int __thiscall OpenMD::OpenMDBitSet::nthOffBit(OpenMDBitSet *this,unsigned_long n)

{
  int iVar1;
  int i;
  vector<int,_std::allocator<int>_> indices;
  int local_4c;
  void *local_48;
  iterator iStack_40;
  int *local_38;
  
  local_48 = (void *)0x0;
  iStack_40._M_current = (int *)0x0;
  local_38 = (int *)0x0;
  local_4c = firstOffBit(this);
  if (local_4c != -1) {
    do {
      if (iStack_40._M_current == local_38) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_48,iStack_40,&local_4c);
      }
      else {
        *iStack_40._M_current = local_4c;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      local_4c = nextOffBit(this,local_4c);
    } while (local_4c != -1);
  }
  iVar1 = -1;
  if (n < (ulong)((long)iStack_40._M_current - (long)local_48 >> 2)) {
    iVar1 = *(int *)((long)local_48 + n * 4);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return iVar1;
}

Assistant:

int OpenMDBitSet::nthOffBit(unsigned long int n) const {
    std::vector<int> indices;
    for (int i = firstOffBit(); i != -1; i = nextOffBit(i)) {
      indices.push_back(i);
    }

    if (n < indices.size()) return indices[n];
    return -1;
  }